

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_ktx_texture.cpp
# Opt level: O0

bool __thiscall
crnlib::ktx_texture::read_from_stream(ktx_texture *this,data_stream_serializer *serializer)

{
  uint32 uVar1;
  uint uVar2;
  data_stream_serializer *pdVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uchar *puVar11;
  ssize_t sVar12;
  data_stream *pdVar13;
  undefined4 extraout_var;
  vector<unsigned_char> *this_00;
  uint local_1bc;
  uint local_194;
  uint32 local_158;
  uint num_mip_pad_bytes_1;
  uint8_vec *image_data_1;
  uint local_108;
  uint local_104;
  uint slice_size_2;
  uint zslice_1;
  uint face_3;
  uint array_element_1;
  uint num_image_bytes_remaining;
  uint num_cube_pad_bytes_1;
  uint8_vec *image_data;
  uint local_d8;
  int local_d4;
  uint face_2;
  uint total_mip_size_1;
  uint32 image_size;
  uint mip_col_blocks_1;
  uint mip_row_blocks_1;
  uint mip_depth_1;
  uint mip_height_1;
  uint mip_width_1;
  uint mip_level_1;
  uint num_mip_pad_bytes;
  uint slice_size_1;
  uint zslice;
  uint face_1;
  uint array_element;
  uint total_mip_size;
  uint num_cube_pad_bytes;
  uint slice_size;
  uint face;
  uint mip_col_blocks;
  uint mip_row_blocks;
  uint mip_depth;
  uint mip_height;
  uint mip_width;
  uint mip_level;
  size_t expected_bytes_remaining;
  uint local_68;
  bool disable_mip_and_cubemap_padding;
  uint uStack_64;
  bool has_valid_image_size_fields;
  uint mip0_col_blocks;
  uint mip0_row_blocks;
  uint total_faces;
  uint padding;
  undefined1 local_48 [8];
  uint8_vec key_value_data;
  uint local_30;
  uint32 key_value_byte_size;
  uint num_key_value_bytes_remaining;
  uint8 pad_bytes [3];
  data_stream_serializer *serializer_local;
  ktx_texture *this_local;
  
  _num_key_value_bytes_remaining = serializer;
  clear(this);
  uVar10 = data_stream_serializer::read(_num_key_value_bytes_remaining,(int)this,(void *)0x1,0x40);
  if ((uVar10 & 0xffffffff) == 0x40) {
    iVar5 = memcmp(&s_ktx_file_id,this,0xc);
    if (iVar5 == 0) {
      if (((this->m_header).m_endianness == 0x1020304) ||
         ((this->m_header).m_endianness == 0x4030201)) {
        this->m_opposite_endianness = (this->m_header).m_endianness == 0x1020304;
        if (((this->m_opposite_endianness & 1U) == 0) ||
           (((ktx_header::endian_swap(&this->m_header), (this->m_header).m_glTypeSize == 1 ||
             ((this->m_header).m_glTypeSize == 2)) || ((this->m_header).m_glTypeSize == 4)))) {
          bVar4 = check_header(this);
          if (bVar4) {
            bVar4 = compute_pixel_info(this);
            if (bVar4) {
              local_30 = (this->m_header).m_bytesOfKeyValueData;
              do {
                if (local_30 == 0) {
                  uVar6 = get_num_mips(this);
                  uVar7 = get_array_size(this);
                  uVar8 = get_num_faces(this);
                  uVar9 = get_depth(this);
                  mip0_col_blocks = uVar6 * uVar7 * uVar8 * uVar9;
                  if ((mip0_col_blocks == 0) || (0xffff < mip0_col_blocks)) {
                    this_local._7_1_ = 0;
                  }
                  else {
                    uStack_64 = (((this->m_header).m_pixelWidth + this->m_block_dim) - 1) /
                                this->m_block_dim;
                    if ((this->m_header).m_pixelHeight < 2) {
                      local_158 = 1;
                    }
                    else {
                      local_158 = (this->m_header).m_pixelHeight;
                    }
                    local_68 = ((local_158 + this->m_block_dim) - 1) / this->m_block_dim;
                    if ((uStack_64 != 0) && (local_68 != 0)) {
                      expected_bytes_remaining._7_1_ = 1;
                      expected_bytes_remaining._6_1_ = 0;
                      _mip_width = 0;
                      mip_height = 0;
                      goto LAB_00205ff0;
                    }
                    this_local._7_1_ = 0;
                  }
                  break;
                }
                if (local_30 < 4) {
                  this_local._7_1_ = 0;
                  break;
                }
                uVar10 = data_stream_serializer::read
                                   (_num_key_value_bytes_remaining,(int)&key_value_data + 0xc,
                                    (void *)0x1,4);
                if ((uVar10 & 0xffffffff) != 4) {
                  this_local._7_1_ = 0;
                  break;
                }
                local_30 = local_30 - 4;
                if ((this->m_opposite_endianness & 1U) != 0) {
                  key_value_data.m_capacity =
                       key_value_data.m_capacity >> 0x18 |
                       (key_value_data.m_capacity & 0xff0000) >> 8 |
                       (key_value_data.m_capacity & 0xff00) << 8 | key_value_data.m_capacity << 0x18
                  ;
                }
                if (local_30 < key_value_data.m_capacity) {
                  this_local._7_1_ = 0;
                  break;
                }
                vector<unsigned_char>::vector((vector<unsigned_char> *)local_48);
                if (key_value_data.m_capacity == 0) {
LAB_00205e36:
                  vector<crnlib::vector<unsigned_char>_>::push_back
                            (&this->m_key_values,(vector<unsigned_char> *)local_48);
                  mip0_row_blocks = 3 - (key_value_data.m_capacity + 3 & 3);
                  if ((mip0_row_blocks == 0) ||
                     (sVar12 = data_stream_serializer::read
                                         (_num_key_value_bytes_remaining,
                                          (int)&key_value_byte_size + 1,(void *)0x1,
                                          (ulong)mip0_row_blocks), (uint)sVar12 == mip0_row_blocks))
                  {
                    local_30 = local_30 - key_value_data.m_capacity;
                    if (local_30 < mip0_row_blocks) {
                      this_local._7_1_ = 0;
                      total_faces = 1;
                    }
                    else {
                      local_30 = local_30 - mip0_row_blocks;
                      total_faces = 0;
                    }
                  }
                  else {
                    this_local._7_1_ = 0;
                    total_faces = 1;
                  }
                }
                else {
                  vector<unsigned_char>::resize
                            ((vector<unsigned_char> *)local_48,key_value_data.m_capacity,false);
                  pdVar3 = _num_key_value_bytes_remaining;
                  puVar11 = vector<unsigned_char>::operator[]((vector<unsigned_char> *)local_48,0);
                  sVar12 = data_stream_serializer::read
                                     (pdVar3,(int)puVar11,(void *)0x1,
                                      (ulong)key_value_data.m_capacity);
                  if ((uint)sVar12 == key_value_data.m_capacity) goto LAB_00205e36;
                  this_local._7_1_ = 0;
                  total_faces = 1;
                }
                vector<unsigned_char>::~vector((vector<unsigned_char> *)local_48);
              } while (total_faces == 0);
            }
            else {
              this_local._7_1_ = 0;
            }
          }
          else {
            this_local._7_1_ = 0;
          }
        }
        else {
          this_local._7_1_ = 0;
        }
      }
      else {
        this_local._7_1_ = 0;
      }
    }
    else {
      this_local._7_1_ = 0;
    }
  }
  else {
    this_local._7_1_ = 0;
  }
  goto LAB_002068c9;
LAB_00205ff0:
  uVar6 = mip_height;
  uVar7 = get_num_mips(this);
  if (uVar7 <= uVar6) goto LAB_00206277;
  get_mip_dim(this,mip_height,&mip_depth,&mip_row_blocks,&mip_col_blocks);
  face = ((mip_depth + this->m_block_dim) - 1) / this->m_block_dim;
  slice_size = ((mip_row_blocks + this->m_block_dim) - 1) / this->m_block_dim;
  if ((face == 0) || (slice_size == 0)) {
    this_local._7_1_ = 0;
    goto LAB_002068c9;
  }
  _mip_width = _mip_width + 4;
  if (((this->m_header).m_numberOfArrayElements == 0) && (uVar6 = get_num_faces(this), uVar6 == 6))
  {
    for (num_cube_pad_bytes = 0; uVar6 = num_cube_pad_bytes, uVar7 = get_num_faces(this),
        uVar6 < uVar7; num_cube_pad_bytes = num_cube_pad_bytes + 1) {
      total_mip_size = face * slice_size * this->m_bytes_per_block;
      array_element = 3 - (total_mip_size + 3 & 3);
      _mip_width = (ulong)array_element + total_mip_size + _mip_width;
    }
  }
  else {
    face_1 = 0;
    for (zslice = 0; uVar6 = zslice, uVar7 = get_array_size(this), uVar6 < uVar7;
        zslice = zslice + 1) {
      for (slice_size_1 = 0; uVar6 = slice_size_1, uVar7 = get_num_faces(this), uVar6 < uVar7;
          slice_size_1 = slice_size_1 + 1) {
        for (num_mip_pad_bytes = 0; num_mip_pad_bytes < mip_col_blocks;
            num_mip_pad_bytes = num_mip_pad_bytes + 1) {
          mip_level_1 = face * slice_size * this->m_bytes_per_block;
          face_1 = mip_level_1 + face_1;
        }
      }
    }
    mip_width_1 = 3 - (face_1 + 3 & 3);
    _mip_width = (ulong)mip_width_1 + face_1 + _mip_width;
  }
  mip_height = mip_height + 1;
  goto LAB_00205ff0;
LAB_00206277:
  pdVar13 = data_stream_serializer::get_stream(_num_key_value_bytes_remaining);
  iVar5 = (*pdVar13->_vptr_data_stream[10])();
  if (CONCAT44(extraout_var,iVar5) < _mip_width) {
    expected_bytes_remaining._7_1_ = 0;
    expected_bytes_remaining._6_1_ = 1;
    console::warning(
                    "ktx_texture::read_from_stream: KTX file size is smaller than expected - trying to read anyway without imageSize fields"
                    );
  }
  for (mip_height_1 = 0; uVar6 = mip_height_1, uVar7 = get_num_mips(this), uVar6 < uVar7;
      mip_height_1 = mip_height_1 + 1) {
    get_mip_dim(this,mip_height_1,&mip_depth_1,&mip_row_blocks_1,&mip_col_blocks_1);
    image_size = ((mip_depth_1 + this->m_block_dim) - 1) / this->m_block_dim;
    total_mip_size_1 = ((mip_row_blocks_1 + this->m_block_dim) - 1) / this->m_block_dim;
    if ((image_size == 0) || (total_mip_size_1 == 0)) {
      this_local._7_1_ = 0;
      goto LAB_002068c9;
    }
    face_2 = 0;
    if ((expected_bytes_remaining._7_1_ & 1) == 0) {
      iVar5 = mip_col_blocks_1 * image_size * total_mip_size_1;
      uVar1 = this->m_bytes_per_block;
      uVar6 = get_array_size(this);
      uVar7 = get_num_faces(this);
      face_2 = iVar5 * uVar1 * uVar6 * uVar7;
    }
    else {
      uVar10 = data_stream_serializer::read
                         (_num_key_value_bytes_remaining,(int)&face_2,(void *)0x1,4);
      if ((uVar10 & 0xffffffff) != 4) {
        this_local._7_1_ = 0;
        goto LAB_002068c9;
      }
      if ((this->m_opposite_endianness & 1U) != 0) {
        face_2 = face_2 >> 0x18 | (face_2 & 0xff0000) >> 8 | (face_2 & 0xff00) << 8 | face_2 << 0x18
        ;
      }
    }
    if (face_2 == 0) {
      this_local._7_1_ = 0;
      goto LAB_002068c9;
    }
    local_d4 = 0;
    if (((this->m_header).m_numberOfArrayElements == 0) && (uVar6 = get_num_faces(this), uVar6 == 6)
       ) {
      for (local_d8 = 0; uVar2 = local_d8, uVar6 = get_num_faces(this), uVar2 < uVar6;
          local_d8 = local_d8 + 1) {
        vector<unsigned_char>::vector((vector<unsigned_char> *)&image_data);
        vector<crnlib::vector<unsigned_char>_>::push_back
                  (&this->m_image_data,(vector<unsigned_char> *)&image_data);
        vector<unsigned_char>::~vector((vector<unsigned_char> *)&image_data);
        _num_image_bytes_remaining =
             vector<crnlib::vector<unsigned_char>_>::back(&this->m_image_data);
        vector<unsigned_char>::resize(_num_image_bytes_remaining,face_2,false);
        pdVar3 = _num_key_value_bytes_remaining;
        puVar11 = vector<unsigned_char>::operator[](_num_image_bytes_remaining,0);
        sVar12 = data_stream_serializer::read(pdVar3,(int)puVar11,(void *)0x1,(ulong)face_2);
        if ((uint)sVar12 != face_2) {
          this_local._7_1_ = 0;
          goto LAB_002068c9;
        }
        if ((this->m_opposite_endianness & 1U) != 0) {
          puVar11 = vector<unsigned_char>::operator[](_num_image_bytes_remaining,0);
          utils::endian_swap_mem(puVar11,face_2,(this->m_header).m_glTypeSize);
        }
        if ((expected_bytes_remaining._6_1_ & 1) == 0) {
          local_194 = 3 - (face_2 + 3 & 3);
        }
        else {
          local_194 = 0;
        }
        array_element_1 = local_194;
        sVar12 = data_stream_serializer::read
                           (_num_key_value_bytes_remaining,(int)&key_value_byte_size + 1,(void *)0x1
                            ,(ulong)local_194);
        if ((uint)sVar12 != array_element_1) {
          this_local._7_1_ = 0;
          goto LAB_002068c9;
        }
        local_d4 = face_2 + array_element_1 + local_d4;
      }
    }
    else {
      face_3 = face_2;
      for (zslice_1 = 0; uVar6 = zslice_1, uVar7 = get_array_size(this), uVar6 < uVar7;
          zslice_1 = zslice_1 + 1) {
        for (slice_size_2 = 0; uVar6 = slice_size_2, uVar7 = get_num_faces(this), uVar6 < uVar7;
            slice_size_2 = slice_size_2 + 1) {
          for (local_104 = 0; local_104 < mip_col_blocks_1; local_104 = local_104 + 1) {
            local_108 = image_size * total_mip_size_1 * this->m_bytes_per_block;
            if ((local_108 == 0) || (face_3 < local_108)) {
              this_local._7_1_ = 0;
              goto LAB_002068c9;
            }
            vector<unsigned_char>::vector((vector<unsigned_char> *)&image_data_1);
            vector<crnlib::vector<unsigned_char>_>::push_back
                      (&this->m_image_data,(vector<unsigned_char> *)&image_data_1);
            vector<unsigned_char>::~vector((vector<unsigned_char> *)&image_data_1);
            this_00 = vector<crnlib::vector<unsigned_char>_>::back(&this->m_image_data);
            vector<unsigned_char>::resize(this_00,local_108,false);
            pdVar3 = _num_key_value_bytes_remaining;
            puVar11 = vector<unsigned_char>::operator[](this_00,0);
            sVar12 = data_stream_serializer::read(pdVar3,(int)puVar11,(void *)0x1,(ulong)local_108);
            if ((uint)sVar12 != local_108) {
              this_local._7_1_ = 0;
              goto LAB_002068c9;
            }
            if ((this->m_opposite_endianness & 1U) != 0) {
              puVar11 = vector<unsigned_char>::operator[](this_00,0);
              utils::endian_swap_mem(puVar11,local_108,(this->m_header).m_glTypeSize);
            }
            face_3 = face_3 - local_108;
            local_d4 = local_108 + local_d4;
          }
        }
      }
      if (face_3 != 0) {
        this_local._7_1_ = 0;
        goto LAB_002068c9;
      }
    }
    if ((expected_bytes_remaining._6_1_ & 1) == 0) {
      local_1bc = 3 - (local_d4 + 3U & 3);
    }
    else {
      local_1bc = 0;
    }
    sVar12 = data_stream_serializer::read
                       (_num_key_value_bytes_remaining,(int)&key_value_byte_size + 1,(void *)0x1,
                        (ulong)local_1bc);
    if ((uint)sVar12 != local_1bc) {
      this_local._7_1_ = 0;
      goto LAB_002068c9;
    }
  }
  this_local._7_1_ = 1;
LAB_002068c9:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ktx_texture::read_from_stream(data_stream_serializer& serializer)
    {
        clear();

        // Read header
        if (serializer.read(&m_header, 1, sizeof(m_header)) != sizeof(ktx_header))
        {
            return false;
        }

        // Check header
        if (memcmp(s_ktx_file_id, m_header.m_identifier, sizeof(m_header.m_identifier)))
        {
            return false;
        }

        if ((m_header.m_endianness != KTX_OPPOSITE_ENDIAN) && (m_header.m_endianness != KTX_ENDIAN))
        {
            return false;
        }

        m_opposite_endianness = (m_header.m_endianness == KTX_OPPOSITE_ENDIAN);
        if (m_opposite_endianness)
        {
            m_header.endian_swap();

            if ((m_header.m_glTypeSize != sizeof(uint8)) && (m_header.m_glTypeSize != sizeof(uint16)) && (m_header.m_glTypeSize != sizeof(uint32)))
            {
                return false;
            }
        }

        if (!check_header())
        {
            return false;
        }

        if (!compute_pixel_info())
        {
            return false;
        }

        uint8 pad_bytes[3];

        // Read the key value entries
        uint num_key_value_bytes_remaining = m_header.m_bytesOfKeyValueData;
        while (num_key_value_bytes_remaining)
        {
            if (num_key_value_bytes_remaining < sizeof(uint32))
            {
                return false;
            }

            uint32 key_value_byte_size;
            if (serializer.read(&key_value_byte_size, 1, sizeof(uint32)) != sizeof(uint32))
            {
                return false;
            }

            num_key_value_bytes_remaining -= sizeof(uint32);

            if (m_opposite_endianness)
            {
                key_value_byte_size = utils::swap32(key_value_byte_size);
            }

            if (key_value_byte_size > num_key_value_bytes_remaining)
            {
                return false;
            }

            uint8_vec key_value_data;
            if (key_value_byte_size)
            {
                key_value_data.resize(key_value_byte_size);
                if (serializer.read(&key_value_data[0], 1, key_value_byte_size) != key_value_byte_size)
                {
                    return false;
                }
            }

            m_key_values.push_back(key_value_data);

            uint padding = 3 - ((key_value_byte_size + 3) % 4);
            if (padding)
            {
                if (serializer.read(pad_bytes, 1, padding) != padding)
                {
                    return false;
                }
            }

            num_key_value_bytes_remaining -= key_value_byte_size;
            if (num_key_value_bytes_remaining < padding)
            {
                return false;
            }
            num_key_value_bytes_remaining -= padding;
        }

        // Now read the mip levels
        uint total_faces = get_num_mips() * get_array_size() * get_num_faces() * get_depth();
        if ((!total_faces) || (total_faces > 65535))
        {
            return false;
        }

// See Section 2.8 of KTX file format: No rounding to block sizes should be applied for block compressed textures.
// OK, I'm going to break that rule otherwise KTX can only store a subset of textures that DDS can handle for no good reason.
#if 0
      const uint mip0_row_blocks = m_header.m_pixelWidth / m_block_dim;
      const uint mip0_col_blocks = CRNLIB_MAX(1, m_header.m_pixelHeight) / m_block_dim;
#else
        const uint mip0_row_blocks = (m_header.m_pixelWidth + m_block_dim - 1) / m_block_dim;
        const uint mip0_col_blocks = (CRNLIB_MAX(1, m_header.m_pixelHeight) + m_block_dim - 1) / m_block_dim;
#endif
        if ((!mip0_row_blocks) || (!mip0_col_blocks))
        {
            return false;
        }

        bool has_valid_image_size_fields = true;
        bool disable_mip_and_cubemap_padding = false;

#if CRNLIB_KTX_PVRTEX_WORKAROUNDS
        {
            // PVRTexTool has a bogus KTX writer that doesn't write any imageSize fields. Nice.
            size_t expected_bytes_remaining = 0;
            for (uint mip_level = 0; mip_level < get_num_mips(); mip_level++)
            {
                uint mip_width, mip_height, mip_depth;
                get_mip_dim(mip_level, mip_width, mip_height, mip_depth);

                const uint mip_row_blocks = (mip_width + m_block_dim - 1) / m_block_dim;
                const uint mip_col_blocks = (mip_height + m_block_dim - 1) / m_block_dim;
                if ((!mip_row_blocks) || (!mip_col_blocks))
                {
                    return false;
                }

                expected_bytes_remaining += sizeof(uint32);

                if ((!m_header.m_numberOfArrayElements) && (get_num_faces() == 6))
                {
                    for (uint face = 0; face < get_num_faces(); face++)
                    {
                        uint slice_size = mip_row_blocks * mip_col_blocks * m_bytes_per_block;
                        expected_bytes_remaining += slice_size;

                        uint num_cube_pad_bytes = 3 - ((slice_size + 3) % 4);
                        expected_bytes_remaining += num_cube_pad_bytes;
                    }
                }
                else
                {
                    uint total_mip_size = 0;
                    for (uint array_element = 0; array_element < get_array_size(); array_element++)
                    {
                        for (uint face = 0; face < get_num_faces(); face++)
                        {
                            for (uint zslice = 0; zslice < mip_depth; zslice++)
                            {
                                uint slice_size = mip_row_blocks * mip_col_blocks * m_bytes_per_block;
                                total_mip_size += slice_size;
                            }
                        }
                    }
                    expected_bytes_remaining += total_mip_size;

                    uint num_mip_pad_bytes = 3 - ((total_mip_size + 3) % 4);
                    expected_bytes_remaining += num_mip_pad_bytes;
                }
            }

            if (serializer.get_stream()->get_remaining() < expected_bytes_remaining)
            {
                has_valid_image_size_fields = false;
                disable_mip_and_cubemap_padding = true;
                console::warning("ktx_texture::read_from_stream: KTX file size is smaller than expected - trying to read anyway without imageSize fields");
            }
        }
#endif

        for (uint mip_level = 0; mip_level < get_num_mips(); mip_level++)
        {
            uint mip_width, mip_height, mip_depth;
            get_mip_dim(mip_level, mip_width, mip_height, mip_depth);

            const uint mip_row_blocks = (mip_width + m_block_dim - 1) / m_block_dim;
            const uint mip_col_blocks = (mip_height + m_block_dim - 1) / m_block_dim;
            if ((!mip_row_blocks) || (!mip_col_blocks))
            {
                return false;
            }

            uint32 image_size = 0;
            if (!has_valid_image_size_fields)
            {
                image_size = mip_depth * mip_row_blocks * mip_col_blocks * m_bytes_per_block * get_array_size() * get_num_faces();
            }
            else
            {
                if (serializer.read(&image_size, 1, sizeof(image_size)) != sizeof(image_size))
                {
                    return false;
                }

                if (m_opposite_endianness)
                {
                    image_size = utils::swap32(image_size);
                }
            }

            if (!image_size)
            {
                return false;
            }

            uint total_mip_size = 0;

            if ((!m_header.m_numberOfArrayElements) && (get_num_faces() == 6))
            {
                // plain non-array cubemap
                for (uint face = 0; face < get_num_faces(); face++)
                {
                    CRNLIB_ASSERT(m_image_data.size() == get_image_index(mip_level, 0, face, 0));

                    m_image_data.push_back(uint8_vec());
                    uint8_vec& image_data = m_image_data.back();

                    image_data.resize(image_size);
                    if (serializer.read(&image_data[0], 1, image_size) != image_size)
                    {
                        return false;
                    }

                    if (m_opposite_endianness)
                    {
                        utils::endian_swap_mem(&image_data[0], image_size, m_header.m_glTypeSize);
                    }

                    uint num_cube_pad_bytes = disable_mip_and_cubemap_padding ? 0 : (3 - ((image_size + 3) % 4));
                    if (serializer.read(pad_bytes, 1, num_cube_pad_bytes) != num_cube_pad_bytes)
                    {
                        return false;
                    }

                    total_mip_size += image_size + num_cube_pad_bytes;
                }
            }
            else
            {
                // 1D, 2D, 3D (normal or array texture), or array cubemap
                uint num_image_bytes_remaining = image_size;

                for (uint array_element = 0; array_element < get_array_size(); array_element++)
                {
                    for (uint face = 0; face < get_num_faces(); face++)
                    {
                        for (uint zslice = 0; zslice < mip_depth; zslice++)
                        {
                            CRNLIB_ASSERT(m_image_data.size() == get_image_index(mip_level, array_element, face, zslice));

                            uint slice_size = mip_row_blocks * mip_col_blocks * m_bytes_per_block;
                            if ((!slice_size) || (slice_size > num_image_bytes_remaining))
                            {
                                return false;
                            }

                            m_image_data.push_back(uint8_vec());
                            uint8_vec& image_data = m_image_data.back();

                            image_data.resize(slice_size);
                            if (serializer.read(&image_data[0], 1, slice_size) != slice_size)
                            {
                                return false;
                            }

                            if (m_opposite_endianness)
                            {
                                utils::endian_swap_mem(&image_data[0], slice_size, m_header.m_glTypeSize);
                            }

                            num_image_bytes_remaining -= slice_size;

                            total_mip_size += slice_size;
                        }
                    }
                }

                if (num_image_bytes_remaining)
                {
                    return false;
                }
            }

            uint num_mip_pad_bytes = disable_mip_and_cubemap_padding ? 0 : (3 - ((total_mip_size + 3) % 4));
            if (serializer.read(pad_bytes, 1, num_mip_pad_bytes) != num_mip_pad_bytes)
            {
                return false;
            }
        }
        return true;
    }